

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

string * __thiscall
cmWatchpoint::GetTypeAsString_abi_cxx11_
          (string *__return_storage_ptr__,cmWatchpoint *this,WatchpointType type)

{
  byte bVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  WatchpointType local_74;
  const_iterator pWStack_70;
  WatchpointType field;
  const_iterator __end1;
  const_iterator __begin1;
  undefined8 local_58;
  undefined8 local_50;
  initializer_list<cmWatchpoint::WatchpointType> local_48;
  initializer_list<cmWatchpoint::WatchpointType> *local_38;
  initializer_list<cmWatchpoint::WatchpointType> *__range1;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  WatchpointType local_14;
  string *psStack_10;
  WatchpointType type_local;
  string *rtn;
  
  local_14 = (WatchpointType)this;
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NONE",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"DEFINE",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"WRITE",(allocator *)((long)&__range1 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
    break;
  default:
    __range1._5_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    __begin1 = (const_iterator)0x800000002;
    local_58 = 0x100000004;
    local_50 = 0xf0000000b;
    local_48._M_array = (iterator)&__begin1;
    local_48._M_len = 6;
    local_38 = &local_48;
    __end1 = std::initializer_list<cmWatchpoint::WatchpointType>::begin(local_38);
    pWStack_70 = std::initializer_list<cmWatchpoint::WatchpointType>::end(local_38);
    uVar3 = extraout_RDX;
    for (; __end1 != pWStack_70; __end1 = __end1 + 1) {
      local_74 = *__end1;
      if ((local_74 & local_14) != WATCHPOINT_NONE) {
        GetTypeAsString_abi_cxx11_(&local_b8,(cmWatchpoint *)(ulong)local_74,(WatchpointType)uVar3);
        std::operator+(&local_98,&local_b8,", ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        uVar3 = extraout_RDX_00;
      }
    }
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!rtn.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmDebugger.cxx"
                    ,0x23d,
                    "static std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType)"
                   );
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
    }
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"READ",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"UNDEFINED",(allocator *)((long)&__range1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"MODIFY",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ALL",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType type)
{
  switch (type) {
    case WATCHPOINT_NONE:
      return "NONE";
    case WATCHPOINT_ALL:
      return "ALL";
    case WATCHPOINT_MODIFY:
      return "MODIFY";
    case WATCHPOINT_DEFINE:
      return "DEFINE";
    case WATCHPOINT_READ:
      return "READ";
    case WATCHPOINT_UNDEFINED:
      return "UNDEFINED";
    case WATCHPOINT_WRITE:
      return "WRITE";
    default:
      break;
  }

  std::string rtn;
  for (auto field : { WATCHPOINT_WRITE, WATCHPOINT_UNDEFINED, WATCHPOINT_READ,
                      WATCHPOINT_DEFINE, WATCHPOINT_MODIFY, WATCHPOINT_ALL }) {
    if (field & type) {
      rtn += GetTypeAsString(field) + ", ";
    }
  }

  // If it doesn't match any of the bits in the field or none, what exactly was
  // passed in?
  assert(!rtn.empty());

  // Remove last comma and space
  if (!rtn.empty()) {
    rtn.pop_back();
    rtn.pop_back();
  }

  return rtn;
}